

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fib-lace.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint32_t *puVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Worker *pWVar6;
  Task *pTVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  Task *__dq_head;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  timespec tv;
  Task local_70;
  
  iVar3 = getopt(argc,argv,"w:q:h");
  iVar3 = iVar3 << 0x18;
  if (iVar3 == -0x1000000) {
    uVar5 = 1;
    __dq_head = (Task *)0x186a0;
  }
  else {
    iVar4 = 100000;
    uVar5 = 1;
    do {
      iVar3 = iVar3 >> 0x18;
      if (iVar3 == 0x71) {
        iVar4 = atoi(_optarg);
      }
      else if (iVar3 == 0x77) {
        uVar5 = atoi(_optarg);
      }
      else {
        if (iVar3 != 0x68) {
          abort();
        }
        main_cold_1();
      }
      iVar3 = getopt(argc,argv,"w:q:h");
      iVar3 = iVar3 << 0x18;
    } while (iVar3 != -0x1000000);
    __dq_head = (Task *)(long)iVar4;
  }
  if (_optind != argc) {
    lace_start(uVar5,(size_t)__dq_head);
    uVar5 = atoi(argv[_optind]);
    clock_gettime(1,(timespec *)&local_70);
    dVar11 = (double)(long)local_70.f;
    dVar13 = (double)(long)local_70.thief;
    local_70.f = pfib_WRAP;
    local_70.thief = (_Worker *)0x1;
    local_70.d._0_4_ = uVar5;
    lace_run_task(&local_70);
    uVar2 = local_70.d._0_4_;
    clock_gettime(1,(timespec *)&local_70);
    dVar12 = (double)(long)local_70.f;
    dVar14 = (double)(long)local_70.thief;
    printf("fib(%d) = %d\n",(ulong)uVar5,(ulong)(uint)uVar2);
    printf("Time: %f\n",(dVar14 * 1e-09 + dVar12) - (dVar13 * 1e-09 + dVar11));
    lace_stop();
    return 0;
  }
  main_cold_2();
  if (((WorkerP *)argv)->allstolen == '\0') {
    pTVar7 = ((WorkerP *)argv)->split;
    if (pTVar7 <= __dq_head) {
LAB_0010185b:
      pWVar6 = ((WorkerP *)argv)->_public;
      if (pWVar6->movesplit != '\0') {
        uVar10 = ((long)__dq_head - (long)pTVar7 >> 6) + 1U >> 1;
        ((WorkerP *)argv)->split = pTVar7 + uVar10;
        LOCK();
        puVar1 = &(pWVar6->ts).ts.split;
        *puVar1 = *puVar1 + (int)uVar10;
        UNLOCK();
        pWVar6->movesplit = '\0';
      }
      __dq_head->thief = (_Worker *)0x0;
      iVar3 = pfib_CALL((WorkerP *)argv,__dq_head,*(int *)__dq_head->d);
      return iVar3;
    }
    pWVar6 = ((WorkerP *)argv)->_public;
    uVar8 = (pWVar6->ts).ts.tail;
    uVar5 = (pWVar6->ts).ts.split;
    if (uVar8 != uVar5) {
      uVar9 = uVar8 + uVar5 >> 1;
      (pWVar6->ts).ts.split = uVar9;
      uVar8 = (pWVar6->ts).ts.tail;
      if (uVar8 != uVar5) {
        if (uVar9 < uVar8) {
          uVar9 = uVar8 + uVar5 >> 1;
          (pWVar6->ts).ts.split = uVar9;
        }
        pTVar7 = ((WorkerP *)argv)->dq + uVar9;
        ((WorkerP *)argv)->split = pTVar7;
        goto LAB_0010185b;
      }
    }
    pWVar6->allstolen = '\x01';
    ((WorkerP *)argv)->allstolen = '\x01';
  }
  pWVar6 = __dq_head->thief;
  if (pWVar6 == (Worker *)0x2) goto LAB_001017fb;
  if (pWVar6 < (Worker *)0x2) {
    do {
      pWVar6 = __dq_head->thief;
    } while (pWVar6 < (Worker *)0x2);
    if (pWVar6 != (Worker *)0x2) goto LAB_00101790;
  }
  else {
LAB_00101790:
    pTVar7 = __dq_head + 1;
    iVar3 = 0x20;
    do {
      pWVar6 = lace_steal((WorkerP *)argv,pTVar7,pWVar6);
      if (pWVar6 == (Worker *)0x2) {
        if (lace_newframe.t != (Task *)0x0) {
          lace_yield((WorkerP *)argv,pTVar7);
        }
        iVar3 = iVar3 + -1;
        if (iVar3 == 0) {
          lace_steal_random_CALL((WorkerP *)argv,pTVar7);
          iVar3 = 0x20;
        }
      }
      pWVar6 = __dq_head->thief;
    } while (pWVar6 != (Worker *)0x2);
  }
  if (((WorkerP *)argv)->allstolen == '\0') {
    ((WorkerP *)argv)->_public->allstolen = '\x01';
    ((WorkerP *)argv)->allstolen = '\x01';
  }
LAB_001017fb:
  __dq_head->thief = (_Worker *)0x0;
  return *(int *)__dq_head->d;
}

Assistant:

int main(int argc, char **argv)
{
    int workers = 1;
    int dqsize = 100000;

    char c;
    while ((c=getopt(argc, argv, "w:q:h")) != -1) {
        switch (c) {
            case 'w':
                workers = atoi(optarg);
                break;
            case 'q':
                dqsize = atoi(optarg);
                break;
            case 'h':
                usage(argv[0]);
                break;
            default:
                abort();
        }
    }

    if (optind == argc) {
        usage(argv[0]);
        exit(1);
    }

    lace_start(workers, dqsize);

    int n = atoi(argv[optind]);

    double t1 = wctime();
    int m = RUN(pfib, n);
    double t2 = wctime();

    printf("fib(%d) = %d\n", n, m);
    printf("Time: %f\n", t2-t1);

    lace_stop();
    return 0;
}